

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateTable(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  ClientContext *pCVar1;
  Catalog *pCVar2;
  int iVar3;
  pointer pCVar4;
  SchemaCatalogEntry *schema;
  type info;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> ptr;
  shared_ptr<duckdb::Binder,_true> binder;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_40;
  undefined1 local_38 [16];
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_28;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(deserializer,0x65,"table");
  local_40._M_head_impl = (CreateInfo *)0x0;
  iVar3 = (*(this->deserializer).super_Deserializer._vptr_Deserializer[10])(deserializer);
  if ((char)iVar3 == '\0') {
    local_28._M_head_impl = (CreateInfo *)0x0;
  }
  else {
    (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize
              ((CreateInfo *)&stack0xffffffffffffffd8,&deserializer->super_Deserializer);
    local_40._M_head_impl = local_28._M_head_impl;
    (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  }
  (*(deserializer->super_Deserializer)._vptr_Deserializer[0xb])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  if (this->deserialize_only == false) {
    Binder::CreateBinder
              ((Binder *)&stack0xffffffffffffffd8,this->context,
               (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
    pCVar1 = this->context;
    pCVar2 = this->catalog;
    pCVar4 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)&local_40);
    schema = Catalog::GetSchema(pCVar2,pCVar1,&pCVar4->schema);
    local_38._8_8_ = local_40._M_head_impl;
    local_40._M_head_impl = (CreateInfo *)0x0;
    Binder::BindCreateTableCheckpoint
              ((Binder *)local_38,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               (local_38 + 8),schema);
    if ((element_type *)local_38._8_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_38._8_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pCVar1 = this->context;
    pCVar2 = this->catalog;
    info = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)local_38);
    Catalog::CreateTable(pCVar2,pCVar1,info);
    if ((BoundCreateTableInfo *)local_38._0_8_ != (BoundCreateTableInfo *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_38,
                 (BoundCreateTableInfo *)local_38._0_8_);
    }
    local_28._M_head_impl = local_40._M_head_impl;
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
      local_28._M_head_impl = local_40._M_head_impl;
    }
  }
  if ((element_type *)local_28._M_head_impl != (element_type *)0x0) {
    (*(code *)(((((element_type *)local_28._M_head_impl)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              (local_28._M_head_impl);
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateTable() {
	auto info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(101, "table");
	if (DeserializeOnly()) {
		return;
	}
	// bind the constraints to the table again
	auto binder = Binder::CreateBinder(context);
	auto &schema = catalog.GetSchema(context, info->schema);
	auto bound_info = Binder::BindCreateTableCheckpoint(std::move(info), schema);

	catalog.CreateTable(context, *bound_info);
}